

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

bool __thiscall
cmFileCopier::InstallDirectory
          (cmFileCopier *this,string *source,string *destination,MatchProperties match_properties)

{
  cmExecutionStatus *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  unsigned_long uVar6;
  char *pcVar7;
  mode_t local_3ac;
  byte local_35d;
  char *local_358;
  cmAlphaNum local_350;
  cmAlphaNum local_320;
  undefined1 local_2f0 [8];
  string toPath;
  cmAlphaNum local_2c8;
  cmAlphaNum local_298;
  undefined1 local_268 [8];
  string fromPath;
  unsigned_long fileNum;
  unsigned_long numFiles;
  Directory local_230;
  Directory dir;
  mode_t permissions_after;
  mode_t permissions_before;
  mode_t required_permissions;
  mode_t local_214;
  undefined1 local_210 [4];
  mode_t permissions;
  string local_1f0 [48];
  ostringstream local_1c0 [8];
  ostringstream e;
  Status local_48;
  mode_t *local_40;
  mode_t *default_dir_mode;
  string *psStack_30;
  mode_t default_dir_mode_v;
  string *destination_local;
  string *source_local;
  cmFileCopier *this_local;
  mode_t mStack_10;
  MatchProperties match_properties_local;
  
  psStack_30 = destination;
  destination_local = source;
  source_local = (string *)this;
  unique0x100004d2 = match_properties;
  bVar1 = cmsys::SystemTools::FileIsDirectory(destination);
  local_35d = 0;
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FileIsSymlink(psStack_30);
    local_35d = bVar1 ^ 0xff;
  }
  (*this->_vptr_cmFileCopier[5])(this,destination,1,(ulong)((local_35d ^ 0xff) & 1));
  default_dir_mode._4_4_ = 0;
  local_40 = (mode_t *)((long)&default_dir_mode + 4);
  bVar1 = GetDefaultDirectoryPermissions(this,&local_40);
  if (bVar1) {
    local_48 = cmsys::SystemTools::MakeDirectory(psStack_30,local_40);
    bVar1 = cmsys::Status::operator_cast_to_bool(&local_48);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (mStack_10 == 0) {
        local_3ac = this->DirPermissions;
      }
      else {
        local_3ac = mStack_10;
      }
      local_214 = local_3ac;
      if (local_3ac == 0) {
        cmsys::SystemTools::GetPermissions(destination_local,&local_214);
      }
      dir.Internal._0_4_ = 0;
      if ((local_214 & 0x1c0) == 0x1c0) {
        dir.Internal._4_4_ = local_214;
      }
      else {
        dir.Internal._4_4_ = local_214 | 0x1c0;
        dir.Internal._0_4_ = local_214;
      }
      bVar1 = SetPermissions(this,psStack_30,dir.Internal._4_4_);
      if (bVar1) {
        cmsys::Directory::Directory(&local_230);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          cmsys::Directory::Load(&local_230,destination_local,(string *)0x0);
        }
        uVar6 = cmsys::Directory::GetNumberOfFiles(&local_230);
        for (fromPath.field_2._8_8_ = 0; (ulong)fromPath.field_2._8_8_ < uVar6;
            fromPath.field_2._8_8_ = fromPath.field_2._8_8_ + 1) {
          pcVar7 = cmsys::Directory::GetFile(&local_230,fromPath.field_2._8_8_);
          iVar2 = strcmp(pcVar7,".");
          if (iVar2 != 0) {
            pcVar7 = cmsys::Directory::GetFile(&local_230,fromPath.field_2._8_8_);
            iVar2 = strcmp(pcVar7,"..");
            if (iVar2 != 0) {
              cmAlphaNum::cmAlphaNum(&local_298,destination_local);
              cmAlphaNum::cmAlphaNum(&local_2c8,'/');
              toPath.field_2._8_8_ = cmsys::Directory::GetFile(&local_230,fromPath.field_2._8_8_);
              cmStrCat<char_const*>
                        ((string *)local_268,&local_298,&local_2c8,
                         (char **)((long)&toPath.field_2 + 8));
              cmAlphaNum::cmAlphaNum(&local_320,psStack_30);
              cmAlphaNum::cmAlphaNum(&local_350,'/');
              local_358 = cmsys::Directory::GetFile(&local_230,fromPath.field_2._8_8_);
              cmStrCat<char_const*>((string *)local_2f0,&local_320,&local_350,&local_358);
              uVar3 = (*this->_vptr_cmFileCopier[3])(this,local_268,local_2f0);
              bVar1 = (uVar3 & 1) == 0;
              if (bVar1) {
                match_properties_local._3_1_ = 0;
              }
              std::__cxx11::string::~string((string *)local_2f0);
              std::__cxx11::string::~string((string *)local_268);
              if (bVar1) goto LAB_006895d8;
            }
          }
        }
        match_properties_local._3_1_ = SetPermissions(this,psStack_30,(mode_t)dir.Internal);
LAB_006895d8:
        cmsys::Directory::~Directory(&local_230);
      }
      else {
        match_properties_local._3_1_ = 0;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1c0);
      poVar4 = std::operator<<((ostream *)local_1c0,this->Name);
      poVar4 = std::operator<<(poVar4," cannot make directory \"");
      poVar4 = std::operator<<(poVar4,(string *)psStack_30);
      poVar4 = std::operator<<(poVar4,"\": ");
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,local_1f0);
      std::operator<<(poVar4,".");
      std::__cxx11::string::~string(local_1f0);
      this_00 = this->Status;
      std::__cxx11::ostringstream::str();
      cmExecutionStatus::SetError(this_00,(string *)local_210);
      std::__cxx11::string::~string((string *)local_210);
      match_properties_local._3_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1c0);
    }
  }
  else {
    match_properties_local._3_1_ = 0;
  }
  return (bool)(match_properties_local._3_1_ & 1);
}

Assistant:

bool cmFileCopier::InstallDirectory(const std::string& source,
                                    const std::string& destination,
                                    MatchProperties match_properties)
{
  // Inform the user about this directory installation.
  this->ReportCopy(destination, TypeDir,
                   !( // Report "Up-to-date:" for existing directories,
                      // but not symlinks to them.
                     cmSystemTools::FileIsDirectory(destination) &&
                     !cmSystemTools::FileIsSymlink(destination)));

  // check if default dir creation permissions were set
  mode_t default_dir_mode_v = 0;
  mode_t* default_dir_mode = &default_dir_mode_v;
  if (!this->GetDefaultDirectoryPermissions(&default_dir_mode)) {
    return false;
  }

  // Make sure the destination directory exists.
  if (!cmSystemTools::MakeDirectory(destination, default_dir_mode)) {
    std::ostringstream e;
    e << this->Name << " cannot make directory \"" << destination
      << "\": " << cmSystemTools::GetLastSystemError() << ".";
    this->Status.SetError(e.str());
    return false;
  }

  // Compute the requested permissions for the destination directory.
  mode_t permissions =
    (match_properties.Permissions ? match_properties.Permissions
                                  : this->DirPermissions);
  if (!permissions) {
    // No permissions were explicitly provided but the user requested
    // that the source directory permissions be used.
    cmSystemTools::GetPermissions(source, permissions);
  }

  // Compute the set of permissions required on this directory to
  // recursively install files and subdirectories safely.
  mode_t required_permissions =
    mode_owner_read | mode_owner_write | mode_owner_execute;

  // If the required permissions are specified it is safe to set the
  // final permissions now.  Otherwise we must add the required
  // permissions temporarily during file installation.
  mode_t permissions_before = 0;
  mode_t permissions_after = 0;
  if ((permissions & required_permissions) == required_permissions) {
    permissions_before = permissions;
  } else {
    permissions_before = permissions | required_permissions;
    permissions_after = permissions;
  }

  // Set the required permissions of the destination directory.
  if (!this->SetPermissions(destination, permissions_before)) {
    return false;
  }

  // Load the directory contents to traverse it recursively.
  cmsys::Directory dir;
  if (!source.empty()) {
    dir.Load(source);
  }
  unsigned long numFiles = static_cast<unsigned long>(dir.GetNumberOfFiles());
  for (unsigned long fileNum = 0; fileNum < numFiles; ++fileNum) {
    if (!(strcmp(dir.GetFile(fileNum), ".") == 0 ||
          strcmp(dir.GetFile(fileNum), "..") == 0)) {
      std::string fromPath = cmStrCat(source, '/', dir.GetFile(fileNum));
      std::string toPath = cmStrCat(destination, '/', dir.GetFile(fileNum));
      if (!this->Install(fromPath, toPath)) {
        return false;
      }
    }
  }

  // Set the requested permissions of the destination directory.
  return this->SetPermissions(destination, permissions_after);
}